

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

BOOL MAPGetRegionInfo(LPVOID lpAddress,PMEMORY_BASIC_INFORMATION lpBuffer)

{
  _LIST_ENTRY *p_Var1;
  uint uVar2;
  DWORD DVar3;
  CPalThread *pThread_00;
  SIZE_T regionSize;
  PMAPPED_VIEW_LIST pView;
  SIZE_T real_map_sz;
  VOID *real_map_addr;
  _LIST_ENTRY *p_Stack_30;
  UINT MappedSize;
  LIST_ENTRY *pLink;
  CPalThread *pThread;
  BOOL fFound;
  PMEMORY_BASIC_INFORMATION lpBuffer_local;
  LPVOID lpAddress_local;
  
  pThread._4_4_ = 0;
  pThread_00 = CorUnix::InternalGetCurrentThread();
  CorUnix::InternalEnterCriticalSection(pThread_00,&mapping_critsec);
  p_Stack_30 = MappedViewList.Flink;
  do {
    if (p_Stack_30 == &MappedViewList) {
LAB_0015066f:
      CorUnix::InternalLeaveCriticalSection(pThread_00,&mapping_critsec);
      return pThread._4_4_;
    }
    p_Var1 = p_Stack_30[1].Blink;
    uVar2 = ((int)p_Stack_30[2].Flink - 1U & 0xfffff000) + 0x1000;
    if ((p_Var1 <= lpAddress) && (lpAddress < (LPVOID)((long)&p_Var1->Flink + (ulong)uVar2))) {
      if (lpBuffer != (PMEMORY_BASIC_INFORMATION)0x0) {
        lpBuffer->BaseAddress = lpAddress;
        lpBuffer->AllocationProtect = 0;
        lpBuffer->RegionSize =
             (long)p_Var1 + ((ulong)uVar2 - ((ulong)lpAddress & 0xfffffffffffff000));
        lpBuffer->State = 0x1000;
        DVar3 = MAPConvertAccessToProtect(*(DWORD *)&p_Stack_30[2].Blink);
        lpBuffer->Protect = DVar3;
        lpBuffer->Type = 0x40000;
      }
      pThread._4_4_ = 1;
      goto LAB_0015066f;
    }
    p_Stack_30 = p_Stack_30->Flink;
  } while( true );
}

Assistant:

BOOL MAPGetRegionInfo(LPVOID lpAddress,
                      PMEMORY_BASIC_INFORMATION lpBuffer)
{
    BOOL fFound = FALSE;
    CPalThread * pThread = InternalGetCurrentThread();
    
    InternalEnterCriticalSection(pThread, &mapping_critsec);

    for(LIST_ENTRY *pLink = MappedViewList.Flink;
        pLink != &MappedViewList;
        pLink = pLink->Flink)
    {
        UINT MappedSize;
        VOID * real_map_addr;
        SIZE_T real_map_sz;
        PMAPPED_VIEW_LIST pView = CONTAINING_RECORD(pLink, MAPPED_VIEW_LIST, Link);

#if ONE_SHARED_MAPPING_PER_FILEREGION_PER_PROCESS
        real_map_addr = pView->pNMHolder->address;
        real_map_sz = pView->pNMHolder->size;
#else
        real_map_addr = pView->lpAddress;
        real_map_sz = pView->NumberOfBytesToMap;
#endif

        MappedSize = ((real_map_sz-1) & ~VIRTUAL_PAGE_MASK) + VIRTUAL_PAGE_SIZE; 
        if ( real_map_addr <= lpAddress && 
             (VOID *)((UINT_PTR)real_map_addr+MappedSize) > lpAddress )
        {
            if (lpBuffer)
            {
                SIZE_T regionSize = MappedSize + (UINT_PTR) real_map_addr - 
                       ((UINT_PTR) lpAddress & ~VIRTUAL_PAGE_MASK);

                lpBuffer->BaseAddress = lpAddress;
                lpBuffer->AllocationProtect = 0;
                lpBuffer->RegionSize = regionSize;
                lpBuffer->State = MEM_COMMIT;
                lpBuffer->Protect = MAPConvertAccessToProtect(pView->dwDesiredAccess);
                lpBuffer->Type = MEM_MAPPED;
            }

            fFound = TRUE;
            break;
        }
    }

    InternalLeaveCriticalSection(pThread, &mapping_critsec);
    
    return fFound;
}